

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O0

void __thiscall fmp4_stream::box::print(box *this)

{
  _Setw _Var1;
  ostream *poVar2;
  void *this_00;
  box *this_local;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"=================");
  poVar2 = std::operator<<(poVar2,(string *)&this->box_type_);
  poVar2 = std::operator<<(poVar2,"==================");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  _Var1 = std::setw(0x21);
  poVar2 = std::operator<<((ostream *)&std::cout,_Var1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::left);
  poVar2 = std::operator<<(poVar2," box size: ");
  this_00 = (void *)std::ostream::operator<<(poVar2,this->size_);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void box::print() const
	{
		std::cout << "=================" << box_type_ << "==================" << std::endl;
		std::cout << std::setw(33) << std::left << " box size: " << size_ << std::endl;
	}